

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O1

BVHBuildNode * __thiscall
pbrt::BVHAggregate::buildUpperSAH
          (BVHAggregate *this,Allocator alloc,
          vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *treeletRoots,
          int start,int end,atomic<int> *totalNodes)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  BVHBuildNode *pBVar12;
  undefined1 totalNodes_00 [8];
  BVHAggregate *this_00;
  Allocator alloc_00;
  pointer ppBVar13;
  bool bVar14;
  int iVar15;
  undefined4 extraout_var;
  BVHBuildNode *pBVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  int iVar23;
  Float FVar24;
  Point3<float> *pPVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  pointer ppBVar29;
  long lVar30;
  pointer ppBVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 in_XMM19 [16];
  int vb_4;
  BVHBuildNode *local_208;
  int vb_2;
  Tuple3<pbrt::Point3,_float> local_1fc;
  Tuple3<pbrt::Point3,_float> local_1f0;
  int local_1e4;
  vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *local_1e0;
  Float cost [11];
  undefined1 local_1a0 [8];
  undefined8 local_198;
  Allocator local_190;
  BVHSplitBucket buckets [12];
  BVHBuildNode *this_01;
  
  cost[0] = (Float)end;
  buckets[0].count = start;
  if (end <= start) {
    LogFatal<char_const(&)[6],char_const(&)[4],char_const(&)[6],int&,char_const(&)[4],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
               ,0x27c,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [6])0x453157,
               (char (*) [4])0x2d201a9,(char (*) [6])0x453157,&buckets[0].count,
               (char (*) [4])0x2d201a9,(int *)cost);
  }
  if (end - start == 1) {
    this_01 = (treeletRoots->
              super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>).
              _M_impl.super__Vector_impl_data._M_start[start];
  }
  else {
    LOCK();
    (totalNodes->super___atomic_base<int>)._M_i = (totalNodes->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    local_198 = this;
    iVar15 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x38,8);
    this_01 = (BVHBuildNode *)CONCAT44(extraout_var,iVar15);
    (this_01->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
    (this_01->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
    *(undefined8 *)&(this_01->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = 0;
    (this_01->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
    (this_01->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
    this_01->children[0] = (BVHBuildNode *)0x0;
    this_01->children[0] = (BVHBuildNode *)0x0;
    this_01->children[1] = (BVHBuildNode *)0x0;
    this_01->splitAxis = 0;
    this_01->firstPrimOffset = 0;
    *(undefined8 *)&this_01->nPrimitives = 0;
    (this_01->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = 3.4028235e+38;
    (this_01->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = 3.4028235e+38;
    *(undefined8 *)&(this_01->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = 0xff7fffff7f7fffff;
    auVar38._8_4_ = 0xff7fffff;
    auVar38._0_8_ = 0xff7fffffff7fffff;
    auVar38._12_4_ = 0xff7fffff;
    uVar6 = vmovlps_avx(auVar38);
    (this_01->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)uVar6;
    (this_01->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)((ulong)uVar6 >> 0x20);
    auVar43._8_4_ = 0x7f7fffff;
    auVar43._0_8_ = 0x7f7fffff7f7fffff;
    auVar43._12_4_ = 0x7f7fffff;
    lVar30 = (long)end;
    auVar39 = SUB6416(ZEXT464(0xff7fffff),0);
    auVar46 = ZEXT1664(auVar39);
    auVar41 = SUB6416(ZEXT464(0x7f7fffff),0);
    auVar47 = ZEXT1664(auVar41);
    auVar37 = auVar43;
    auVar45 = auVar38;
    if (start < end) {
      auVar37._8_4_ = 0x7f7fffff;
      auVar37._0_8_ = 0x7f7fffff7f7fffff;
      auVar37._12_4_ = 0x7f7fffff;
      lVar17 = (long)start;
      auVar45._8_4_ = 0xff7fffff;
      auVar45._0_8_ = 0xff7fffffff7fffff;
      auVar45._12_4_ = 0xff7fffff;
      auVar46 = ZEXT464(0xff7fffff);
      auVar47 = ZEXT464(0x7f7fffff);
      do {
        pBVar16 = (treeletRoots->
                  super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[lVar17];
        auVar48._8_8_ = 0;
        auVar48._0_8_ = *(ulong *)&(pBVar16->bounds).pMin.super_Tuple3<pbrt::Point3,_float>;
        auVar37 = vminps_avx(auVar48,auVar37);
        auVar48 = vminss_avx(ZEXT416((uint)(pBVar16->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.
                                           z),auVar47._0_16_);
        auVar47 = ZEXT1664(auVar48);
        uVar1 = (pBVar16->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
        uVar7 = (pBVar16->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
        auVar36._4_4_ = uVar7;
        auVar36._0_4_ = uVar1;
        auVar36._8_8_ = 0;
        auVar45 = vmaxps_avx(auVar36,auVar45);
        auVar48 = vmaxss_avx(ZEXT416((uint)(pBVar16->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.
                                           z),auVar46._0_16_);
        auVar46 = ZEXT1664(auVar48);
        lVar17 = lVar17 + 1;
      } while (lVar30 != lVar17);
    }
    if (start < end) {
      lVar17 = (long)start;
      auVar43._8_4_ = 0x7f7fffff;
      auVar43._0_8_ = 0x7f7fffff7f7fffff;
      auVar43._12_4_ = 0x7f7fffff;
      auVar38._8_4_ = 0xff7fffff;
      auVar38._0_8_ = 0xff7fffffff7fffff;
      auVar38._12_4_ = 0xff7fffff;
      auVar42 = ZEXT464(0x7f7fffff);
      auVar40 = ZEXT464(0xff7fffff);
      do {
        pBVar16 = (treeletRoots->
                  super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[lVar17];
        auVar39 = ZEXT416((uint)(((pBVar16->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z +
                                 (pBVar16->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z) * 0.5))
        ;
        auVar41 = vminss_avx(auVar39,auVar42._0_16_);
        auVar42 = ZEXT1664(auVar41);
        uVar6 = *(undefined8 *)&(pBVar16->bounds).pMin.super_Tuple3<pbrt::Point3,_float>;
        uVar2 = (pBVar16->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
        uVar8 = (pBVar16->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
        auVar32._0_4_ = ((float)uVar6 + (float)uVar2) * 0.5;
        auVar32._4_4_ = ((float)((ulong)uVar6 >> 0x20) + (float)uVar8) * 0.5;
        auVar32._8_8_ = 0;
        auVar43 = vminps_avx(auVar32,auVar43);
        auVar38 = vmaxps_avx(auVar32,auVar38);
        auVar39 = vmaxss_avx(auVar39,auVar40._0_16_);
        auVar40 = ZEXT1664(auVar39);
        lVar17 = lVar17 + 1;
      } while (lVar30 != lVar17);
    }
    auVar32 = vsubps_avx(auVar38,auVar43);
    auVar48 = vmovshdup_avx(auVar38);
    auVar36 = vmovshdup_avx(auVar43);
    fVar44 = auVar48._0_4_ - auVar36._0_4_;
    local_1f0.z = auVar39._0_4_;
    local_1fc.z = auVar41._0_4_;
    uVar20 = vcmpps_avx512vl(ZEXT416((uint)fVar44),auVar32,1);
    uVar22 = vcmpps_avx512vl(ZEXT416((uint)(local_1f0.z - local_1fc.z)),auVar32,1);
    iVar15 = 0;
    if ((uVar20 & uVar22 & 1) == 0) {
      iVar15 = (fVar44 <= local_1f0.z - local_1fc.z) + 1;
    }
    buckets[0].count = (int)auVar38._0_4_;
    if ((iVar15 != 0) && (buckets[0].count = (int)auVar48._0_4_, iVar15 != 1)) {
      buckets[0].count = (int)local_1f0.z;
    }
    auVar32 = auVar43;
    if ((iVar15 != 0) && (auVar32 = auVar36, iVar15 != 1)) {
      auVar32 = auVar41;
    }
    cost[0] = auVar32._0_4_;
    local_190.memoryResource = alloc.memoryResource;
    if (((float)buckets[0].count == cost[0]) && (!NAN((float)buckets[0].count) && !NAN(cost[0]))) {
      LogFatal<char_const(&)[25],char_const(&)[25],char_const(&)[25],float&,char_const(&)[25],float&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
                 ,0x292,"Check failed: %s != %s with %s = %s, %s = %s",
                 (char (*) [25])"centroidBounds.pMax[dim]",(char (*) [25])"centroidBounds.pMin[dim]"
                 ,(char (*) [25])"centroidBounds.pMax[dim]",(float *)buckets,
                 (char (*) [25])"centroidBounds.pMin[dim]",cost);
    }
    lVar17 = (long)start;
    lVar18 = 0;
    auVar49._8_4_ = 0xff7fffff;
    auVar49._0_8_ = 0xff7fffffff7fffff;
    auVar49._12_4_ = 0xff7fffff;
    do {
      *(undefined8 *)((long)&buckets[0].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z + lVar18) =
           0;
      *(undefined8 *)((long)&buckets[0].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y + lVar18) =
           0;
      *(undefined8 *)((long)&buckets[0].count + lVar18) = 0;
      *(undefined8 *)((long)&buckets[0].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y + lVar18) =
           0;
      *(undefined8 *)((long)&buckets[0].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x + lVar18) =
           0x7f7fffff7f7fffff;
      *(undefined8 *)((long)&buckets[0].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z + lVar18) =
           0xff7fffff7f7fffff;
      uVar6 = vmovlps_avx(auVar49);
      *(undefined8 *)((long)&buckets[0].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y + lVar18) =
           uVar6;
      lVar18 = lVar18 + 0x1c;
    } while (lVar18 != 0x150);
    if (start < end) {
      ppBVar31 = (treeletRoots->
                 super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      lVar18 = lVar17;
      do {
        pBVar12 = ppBVar31[lVar18];
        pBVar16 = pBVar12;
        if (iVar15 != 0) {
          if (iVar15 == 1) {
            pBVar16 = (BVHBuildNode *)&(pBVar12->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
          }
          else {
            pBVar16 = (BVHBuildNode *)&(pBVar12->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
          }
        }
        if (iVar15 == 0) {
          pPVar25 = &(pBVar12->bounds).pMax;
        }
        else if (iVar15 == 1) {
          pPVar25 = (Point3<float> *)&(pBVar12->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
        }
        else {
          pPVar25 = (Point3<float> *)&(pBVar12->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
        }
        fVar44 = auVar43._0_4_;
        if ((iVar15 != 0) && (fVar44 = auVar36._0_4_, iVar15 != 1)) {
          fVar44 = local_1fc.z;
        }
        auVar32 = auVar38;
        if ((iVar15 != 0) && (auVar32 = auVar48, iVar15 != 1)) {
          auVar32 = auVar39;
        }
        auVar35 = auVar43;
        if ((iVar15 != 0) && (auVar35 = auVar36, iVar15 != 1)) {
          auVar35 = auVar41;
        }
        auVar32 = vsubss_avx512f(auVar32,auVar35);
        FVar24 = (Float)(int)(((((pBVar16->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x +
                                (pPVar25->super_Tuple3<pbrt::Point3,_float>).x) * 0.5 - fVar44) /
                              auVar32._0_4_) * 12.0);
        cost[0] = 1.54143e-44;
        if (FVar24 != 1.68156e-44) {
          cost[0] = FVar24;
        }
        vb_2 = 0;
        if ((int)cost[0] < 0) {
          LogFatal<char_const(&)[2],char_const(&)[2],char_const(&)[2],int&,char_const(&)[2],int&>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
                     ,0x2a5,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [2])0x46e620,
                     (char (*) [2])0x287c073,(char (*) [2])0x46e620,(int *)cost,
                     (char (*) [2])0x287c073,&vb_2);
        }
        vb_2 = 0xc;
        if (0xb < (int)cost[0]) {
          LogFatal<char_const(&)[2],char_const(&)[9],char_const(&)[2],int&,char_const(&)[9],int&>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
                     ,0x2a6,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [2])0x46e620,
                     (char (*) [9])"nBuckets",(char (*) [2])0x46e620,(int *)cost,
                     (char (*) [9])"nBuckets",&vb_2);
        }
        buckets[(uint)cost[0]].count = buckets[(uint)cost[0]].count + 1;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = *(ulong *)&(pBVar12->bounds).pMin.super_Tuple3<pbrt::Point3,_float>;
        uVar3 = buckets[(uint)cost[0]].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
        uVar9 = buckets[(uint)cost[0]].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
        auVar33._4_4_ = uVar9;
        auVar33._0_4_ = uVar3;
        auVar33._8_8_ = 0;
        auVar32 = vminps_avx(auVar35,auVar33);
        uVar4 = buckets[(uint)cost[0]].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
        uVar10 = buckets[(uint)cost[0]].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
        auVar34._4_4_ = uVar10;
        auVar34._0_4_ = uVar4;
        auVar34._8_8_ = 0;
        auVar35 = vminss_avx(ZEXT416((uint)(pBVar12->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.
                                           z),
                             ZEXT416((uint)buckets[(uint)cost[0]].bounds.pMin.
                                           super_Tuple3<pbrt::Point3,_float>.z));
        uVar5 = (pBVar12->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
        uVar11 = (pBVar12->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
        auVar52._4_4_ = uVar11;
        auVar52._0_4_ = uVar5;
        auVar52._8_8_ = 0;
        auVar33 = vmaxps_avx512vl(auVar52,auVar34);
        auVar34 = vmaxss_avx512f(ZEXT416((uint)(pBVar12->bounds).pMax.
                                               super_Tuple3<pbrt::Point3,_float>.z),
                                 ZEXT416((uint)buckets[(uint)cost[0]].bounds.pMax.
                                               super_Tuple3<pbrt::Point3,_float>.z));
        uVar6 = vmovlps_avx(auVar32);
        buckets[(uint)cost[0]].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar6;
        buckets[(uint)cost[0]].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
             (float)(int)((ulong)uVar6 >> 0x20);
        buckets[(uint)cost[0]].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = auVar35._0_4_;
        uVar6 = vmovlps_avx(auVar33);
        buckets[(uint)cost[0]].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar6;
        buckets[(uint)cost[0]].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y =
             (float)(int)((ulong)uVar6 >> 0x20);
        buckets[(uint)cost[0]].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = auVar34._0_4_;
        lVar18 = lVar18 + 1;
      } while (lVar30 != lVar18);
    }
    auVar39 = vsubps_avx(auVar45,auVar37);
    auVar45 = vmovshdup_avx(auVar39);
    fVar44 = auVar46._0_4_ - auVar47._0_4_;
    auVar39 = vfmadd231ss_fma(ZEXT416((uint)(auVar39._0_4_ * fVar44)),auVar45,auVar39);
    auVar45 = vfmadd231ss_fma(auVar39,auVar45,ZEXT416((uint)fVar44));
    lVar19 = 0x1c;
    lVar21 = 0x34;
    auVar39._8_4_ = 0x7f7fffff;
    auVar39._0_8_ = 0x7f7fffff7f7fffff;
    auVar39._12_4_ = 0x7f7fffff;
    lVar18 = 0;
    do {
      lVar26 = 0;
      iVar23 = 0;
      auVar32 = SUB6416(ZEXT464(0xff7fffff),0);
      auVar35 = SUB6416(ZEXT464(0x7f7fffff),0);
      auVar48 = auVar39;
      auVar41 = auVar32;
      auVar37 = auVar49;
      auVar36 = auVar35;
      do {
        auVar50._8_8_ = 0;
        auVar50._0_8_ =
             *(ulong *)((long)&buckets[0].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x + lVar26);
        auVar48 = vminps_avx(auVar50,auVar48);
        auVar36 = vminss_avx(ZEXT416(*(uint *)((long)&buckets[0].bounds.pMin.
                                                      super_Tuple3<pbrt::Point3,_float>.z + lVar26))
                             ,auVar36);
        auVar51._8_8_ = 0;
        auVar51._0_8_ =
             *(ulong *)((long)&buckets[0].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x + lVar26);
        auVar37 = vmaxps_avx(auVar51,auVar37);
        auVar41 = vmaxss_avx(ZEXT416(*(uint *)((long)&buckets[0].bounds.pMax.
                                                      super_Tuple3<pbrt::Point3,_float>.z + lVar26))
                             ,auVar41);
        iVar23 = iVar23 + *(int *)((long)&buckets[0].count + lVar26);
        lVar26 = lVar26 + 0x1c;
      } while (lVar19 != lVar26);
      lVar26 = lVar18 + 1;
      iVar27 = 0;
      lVar28 = lVar21;
      auVar33 = auVar39;
      auVar34 = auVar49;
      do {
        auVar53._8_8_ = 0;
        auVar53._0_8_ = *(ulong *)(local_1a0 + lVar28 + 4);
        auVar33 = vminps_avx512vl(auVar53,auVar33);
        auVar35 = vminss_avx512f(ZEXT416(*(uint *)((long)&local_198 + lVar28 + 4)),auVar35);
        auVar54._8_8_ = 0;
        auVar54._0_8_ =
             *(ulong *)((long)&buckets[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y + lVar28)
        ;
        auVar34 = vmaxps_avx512vl(auVar54,auVar34);
        auVar32 = vmaxss_avx512f(ZEXT416(*(uint *)((long)&buckets[0].count + lVar28)),auVar32);
        iVar27 = iVar27 + *(int *)(local_1a0 + lVar28);
        lVar28 = lVar28 + 0x1c;
      } while (lVar28 != 0x168);
      auVar52 = vcvtsi2ss_avx512f(in_XMM19,iVar23);
      auVar48 = vsubps_avx(auVar37,auVar48);
      auVar37 = vmovshdup_avx(auVar48);
      fVar44 = auVar41._0_4_ - auVar36._0_4_;
      auVar41 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * auVar48._0_4_)),auVar37,auVar48);
      auVar48 = vfmadd231ss_fma(auVar41,auVar37,ZEXT416((uint)fVar44));
      auVar41 = vcvtsi2ss_avx512f(in_XMM19,iVar27);
      auVar36 = vsubps_avx512vl(auVar34,auVar33);
      auVar37 = vmovshdup_avx(auVar36);
      auVar32 = vsubss_avx512f(auVar32,auVar35);
      auVar36 = vfmadd231ss_fma(ZEXT416((uint)(auVar32._0_4_ * auVar36._0_4_)),auVar37,auVar36);
      auVar37 = vfmadd231ss_fma(auVar36,auVar37,auVar32);
      auVar37 = vfmadd231ss_avx512f(ZEXT416((uint)((auVar37._0_4_ + auVar37._0_4_) * auVar41._0_4_))
                                    ,auVar52,ZEXT416((uint)(auVar48._0_4_ + auVar48._0_4_)));
      cost[lVar18] = auVar37._0_4_ / (auVar45._0_4_ + auVar45._0_4_) + 0.125;
      lVar19 = lVar19 + 0x1c;
      lVar21 = lVar21 + 0x1c;
      lVar18 = lVar26;
    } while (lVar26 != 0xb);
    local_208 = (BVHBuildNode *)CONCAT44(local_208._4_4_,start);
    uVar20 = 0;
    uVar22 = 1;
    auVar46 = ZEXT464((uint)cost[0]);
    do {
      fVar44 = auVar46._0_4_;
      auVar45 = vminss_avx(ZEXT416((uint)cost[uVar22]),auVar46._0_16_);
      auVar46 = ZEXT1664(auVar45);
      if (cost[uVar22] < fVar44) {
        uVar20 = uVar22 & 0xffffffff;
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 != 0xb);
    ppBVar29 = (treeletRoots->
               super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
    ppBVar31 = ppBVar29 + lVar17;
    local_1fc._0_8_ = vmovlps_avx(auVar43);
    local_1f0._0_8_ = vmovlps_avx(auVar38);
    local_1e4 = (int)uVar20;
    local_1e0 = treeletRoots;
    local_1a0 = (undefined1  [8])totalNodes;
    if (lVar17 * 8 != lVar30 * 8) {
      ppBVar29 = ppBVar29 + lVar30;
      ppBVar13 = ppBVar31;
      vb_2 = iVar15;
      do {
        while (ppBVar31 = ppBVar13,
              bVar14 = buildUpperSAH::anon_class_32_3_6c4e2daa::operator()
                                 ((anon_class_32_3_6c4e2daa *)&vb_2,*ppBVar31), bVar14) {
          ppBVar31 = ppBVar31 + 1;
          ppBVar13 = ppBVar31;
          if (ppBVar31 == ppBVar29) goto LAB_003b4323;
        }
        do {
          ppBVar29 = ppBVar29 + -1;
          if (ppBVar29 == ppBVar31) goto LAB_003b4323;
          bVar14 = buildUpperSAH::anon_class_32_3_6c4e2daa::operator()
                             ((anon_class_32_3_6c4e2daa *)&vb_2,*ppBVar29);
        } while (!bVar14);
        pBVar16 = *ppBVar31;
        *ppBVar31 = *ppBVar29;
        *ppBVar29 = pBVar16;
        ppBVar13 = ppBVar31 + 1;
      } while (ppBVar29 != ppBVar31 + 1);
      ppBVar31 = ppBVar31 + 1;
    }
LAB_003b4323:
    alloc_00.memoryResource = local_190.memoryResource;
    this_00 = local_198;
    totalNodes_00 = local_1a0;
    iVar23 = (int)((ulong)((long)ppBVar31 -
                          (long)(local_1e0->
                                super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3);
    vb_4 = (int)local_208;
    vb_2 = iVar23;
    if (iVar23 <= (int)local_208) {
      LogFatal<char_const(&)[4],char_const(&)[6],char_const(&)[4],int&,char_const(&)[6],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
                 ,0x2d3,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [4])"mid",
                 (char (*) [6])0x453157,(char (*) [4])"mid",&vb_2,(char (*) [6])0x453157,&vb_4);
    }
    vb_4 = end;
    if (end <= iVar23) {
      LogFatal<char_const(&)[4],char_const(&)[4],char_const(&)[4],int&,char_const(&)[4],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
                 ,0x2d4,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [4])"mid",
                 (char (*) [4])0x2d201a9,(char (*) [4])"mid",&vb_2,(char (*) [4])0x2d201a9,&vb_4);
    }
    local_208 = buildUpperSAH(local_198,local_190,local_1e0,(int)local_208,iVar23,
                              (atomic<int> *)local_1a0);
    pBVar16 = buildUpperSAH(this_00,alloc_00,local_1e0,iVar23,end,(atomic<int> *)totalNodes_00);
    BVHBuildNode::InitInterior(this_01,iVar15,local_208,pBVar16);
  }
  return this_01;
}

Assistant:

BVHBuildNode *BVHAggregate::buildUpperSAH(Allocator alloc,
                                          std::vector<BVHBuildNode *> &treeletRoots,
                                          int start, int end,
                                          std::atomic<int> *totalNodes) const {
    CHECK_LT(start, end);
    int nNodes = end - start;
    if (nNodes == 1)
        return treeletRoots[start];
    (*totalNodes)++;
    BVHBuildNode *node = alloc.new_object<BVHBuildNode>();

    // Compute bounds of all nodes under this HLBVH node
    Bounds3f bounds;
    for (int i = start; i < end; ++i)
        bounds = Union(bounds, treeletRoots[i]->bounds);

    // Compute bound of HLBVH node centroids, choose split dimension _dim_
    Bounds3f centroidBounds;
    for (int i = start; i < end; ++i) {
        Point3f centroid =
            (treeletRoots[i]->bounds.pMin + treeletRoots[i]->bounds.pMax) * 0.5f;
        centroidBounds = Union(centroidBounds, centroid);
    }
    int dim = centroidBounds.MaxDimension();
    // FIXME: if this hits, what do we need to do?
    // Make sure the SAH split below does something... ?
    CHECK_NE(centroidBounds.pMax[dim], centroidBounds.pMin[dim]);

    // Allocate _BVHSplitBucket_ for SAH partition buckets
    constexpr int nBuckets = 12;
    struct BVHSplitBucket {
        int count = 0;
        Bounds3f bounds;
    };
    BVHSplitBucket buckets[nBuckets];

    // Initialize _BVHSplitBucket_ for HLBVH SAH partition buckets
    for (int i = start; i < end; ++i) {
        Float centroid =
            (treeletRoots[i]->bounds.pMin[dim] + treeletRoots[i]->bounds.pMax[dim]) *
            0.5f;
        int b = nBuckets * ((centroid - centroidBounds.pMin[dim]) /
                            (centroidBounds.pMax[dim] - centroidBounds.pMin[dim]));
        if (b == nBuckets)
            b = nBuckets - 1;
        CHECK_GE(b, 0);
        CHECK_LT(b, nBuckets);
        buckets[b].count++;
        buckets[b].bounds = Union(buckets[b].bounds, treeletRoots[i]->bounds);
    }

    // Compute costs for splitting after each bucket
    Float cost[nBuckets - 1];
    for (int i = 0; i < nBuckets - 1; ++i) {
        Bounds3f b0, b1;
        int count0 = 0, count1 = 0;
        for (int j = 0; j <= i; ++j) {
            b0 = Union(b0, buckets[j].bounds);
            count0 += buckets[j].count;
        }
        for (int j = i + 1; j < nBuckets; ++j) {
            b1 = Union(b1, buckets[j].bounds);
            count1 += buckets[j].count;
        }
        cost[i] = .125f + (count0 * b0.SurfaceArea() + count1 * b1.SurfaceArea()) /
                              bounds.SurfaceArea();
    }

    // Find bucket to split at that minimizes SAH metric
    Float minCost = cost[0];
    int minCostSplitBucket = 0;
    for (int i = 1; i < nBuckets - 1; ++i) {
        if (cost[i] < minCost) {
            minCost = cost[i];
            minCostSplitBucket = i;
        }
    }

    // Split nodes and create interior HLBVH SAH node
    BVHBuildNode **pmid = std::partition(
        &treeletRoots[start], &treeletRoots[end - 1] + 1, [=](const BVHBuildNode *node) {
            Float centroid = (node->bounds.pMin[dim] + node->bounds.pMax[dim]) * 0.5f;
            int b = nBuckets * ((centroid - centroidBounds.pMin[dim]) /
                                (centroidBounds.pMax[dim] - centroidBounds.pMin[dim]));
            if (b == nBuckets)
                b = nBuckets - 1;
            CHECK_GE(b, 0);
            CHECK_LT(b, nBuckets);
            return b <= minCostSplitBucket;
        });
    int mid = pmid - &treeletRoots[0];
    CHECK_GT(mid, start);
    CHECK_LT(mid, end);
    node->InitInterior(dim,
                       this->buildUpperSAH(alloc, treeletRoots, start, mid, totalNodes),
                       this->buildUpperSAH(alloc, treeletRoots, mid, end, totalNodes));
    return node;
}